

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseExpr(Parser *this)

{
  TokenType TVar1;
  Parser *in_RSI;
  
  TVar1 = (in_RSI->m_current).type;
  if ((TVar1 == EQUAL_GREATER) || (TVar1 == LEFT_BRACE)) {
    advance(in_RSI);
    parseBlockExpr(this);
  }
  else if ((in_RSI->m_current).type == IF) {
    advance(in_RSI);
    parseIfExpr(this);
  }
  else if ((in_RSI->m_current).type == WHILE) {
    advance(in_RSI);
    parseWhileExpr(this);
  }
  else if ((in_RSI->m_current).type == FOR) {
    advance(in_RSI);
    parseForExpr(this);
  }
  else if ((in_RSI->m_current).type == SWITCH) {
    advance(in_RSI);
    parseSwitchExpr(this);
  }
  else {
    parsePrecAssignment(this);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseExpr() {
        // Expression with block?
        if (consume(TokenType::LEFT_BRACE) ||
            consume(TokenType::EQUAL_GREATER)) return parseBlockExpr();
        if (consume(TokenType::IF))            return parseIfExpr();
        if (consume(TokenType::WHILE))         return parseWhileExpr();
        if (consume(TokenType::FOR))           return parseForExpr();
        if (consume(TokenType::SWITCH))        return parseSwitchExpr();

        // Expression without block. Start at the lowest precedence.
        return parsePrecAssignment();
    }